

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O3

void __thiscall FileInputSource::seek(FileInputSource *this,qpdf_offset_t offset,int whence)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  size_type *psVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  string __str;
  string __str_1;
  ulong *local_150;
  long local_148;
  ulong local_140 [2];
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  iVar3 = QUtil::seek(this->file,offset,whence);
  if (iVar3 != -1) {
    return;
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"seek to ","");
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_70,(ulong)(this->filename)._M_dataplus._M_p);
  local_90 = &local_80;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_e0 = *puVar8;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar8;
    local_f0 = (ulong *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar11 = -offset;
  if (0 < offset) {
    uVar11 = offset;
  }
  uVar12 = 1;
  if (9 < uVar11) {
    uVar9 = uVar11;
    uVar13 = 4;
    do {
      uVar12 = uVar13;
      if (uVar9 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0011fde0;
      }
      if (uVar9 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0011fde0;
      }
      if (uVar9 < 10000) goto LAB_0011fde0;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar13 = uVar12 + 4;
    } while (bVar1);
    uVar12 = uVar12 + 1;
  }
LAB_0011fde0:
  local_150 = local_140;
  std::__cxx11::string::_M_construct((ulong)&local_150,(char)uVar12 - (char)(offset >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_150 - (offset >> 0x3f)),uVar12,uVar11);
  uVar11 = 0xf;
  if (local_f0 != &local_e0) {
    uVar11 = local_e0;
  }
  if (uVar11 < (ulong)(local_148 + local_e8)) {
    uVar11 = 0xf;
    if (local_150 != local_140) {
      uVar11 = local_140[0];
    }
    if (uVar11 < (ulong)(local_148 + local_e8)) goto LAB_0011fe53;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0011fe53:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_150);
  }
  local_130 = &local_120;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_120 = *plVar4;
    uStack_118 = puVar5[3];
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*puVar5;
  }
  local_128 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_c0 = *puVar8;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar8;
    local_d0 = (ulong *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar12 = -whence;
  if (0 < whence) {
    uVar12 = whence;
  }
  uVar13 = 1;
  if (9 < uVar12) {
    uVar11 = (ulong)uVar12;
    uVar2 = 4;
    do {
      uVar13 = uVar2;
      uVar6 = (uint)uVar11;
      if (uVar6 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0011ff72;
      }
      if (uVar6 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0011ff72;
      }
      if (uVar6 < 10000) goto LAB_0011ff72;
      uVar11 = uVar11 / 10000;
      uVar2 = uVar13 + 4;
    } while (99999 < uVar6);
    uVar13 = uVar13 + 1;
  }
LAB_0011ff72:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar13 - (char)(whence >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)whence >> 0x1f) + (long)local_b0),uVar13,uVar12);
  uVar11 = 0xf;
  if (local_d0 != &local_c0) {
    uVar11 = local_c0;
  }
  if (uVar11 < (ulong)(local_a8 + local_c8)) {
    uVar11 = 0xf;
    if (local_b0 != local_a0) {
      uVar11 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00120023;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_00120023:
  local_110 = &local_100;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_100 = *plVar4;
    uStack_f8 = puVar5[3];
  }
  else {
    local_100 = *plVar4;
    local_110 = (long *)*puVar5;
  }
  local_108 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  psVar10 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_50.field_2._M_allocated_capacity = *psVar10;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar10;
    local_50._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  QUtil::throw_system_error(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void
FileInputSource::seek(qpdf_offset_t offset, int whence)
{
    if (QUtil::seek(this->file, offset, whence) == -1) {
        QUtil::throw_system_error(
            std::string("seek to ") + this->filename + ", offset " + std::to_string(offset) + " (" +
            std::to_string(whence) + ")");
    }
}